

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiex.c
# Opt level: O2

HTTPAPIEX_RESULT HTTPAPIEX_Init(void)

{
  HTTPAPIEX_RESULT HVar1;
  HTTPAPI_RESULT HVar2;
  
  if ((useGlobalInitialization == 0) && (HVar2 = HTTPAPI_Init(), HVar2 != HTTPAPI_OK)) {
    HVar1 = HTTPAPIEX_ERROR;
  }
  else {
    useGlobalInitialization = useGlobalInitialization + 1;
    HVar1 = HTTPAPIEX_OK;
  }
  return HVar1;
}

Assistant:

HTTPAPIEX_RESULT HTTPAPIEX_Init(void)
{
    HTTPAPIEX_RESULT result;

    /*Codes_SRS_HTTPAPIEX_21_045: [If HTTPAPIEX_Init is calling more than once, it shall initialize the HTTP by calling HTTAPI_Init only once, and return success for all calls.] */
    if (useGlobalInitialization == 0)
    {
        /*Codes_SRS_HTTPAPIEX_21_044: [HTTPAPIEX_Init shall initialize the HTTP by calling HTTAPI_Init.] */
        if (HTTPAPI_Init() == HTTPAPI_OK)
        {
            useGlobalInitialization++;
            result = HTTPAPIEX_OK;
        }
        else
        {
            /*Codes_SRS_HTTPAPIEX_21_046: [If HTTAPI_Init, HTTPAPIEX_Init shall return HTTPAPIEX_ERROR.] */
            result = HTTPAPIEX_ERROR;
        }
    }
    else
    {
        useGlobalInitialization++;
        result = HTTPAPIEX_OK;
    }

    return result;
}